

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O3

int coda__pcre2_study_8(pcre2_real_code_8 *re)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint8_t *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *in_R8;
  ulong uVar14;
  uint8_t *code;
  int count;
  int depth;
  int local_22c [131];
  
  local_22c[0] = 0;
  uVar11 = re->overall_options & 0x80000;
  lVar8 = (ulong)re->name_count * (ulong)re->name_entry_size;
  code = re[1].start_bitmap + lVar8 + -0x28;
  uVar9 = re->flags;
  if ((uVar9 & 0x210) == 0) {
    local_22c[1] = 0;
    iVar4 = set_start_bits(re,code,(BOOL)(local_22c + 1),(BOOL)lVar8,in_R8);
    if (iVar4 == 1) {
      puVar10 = re->start_bitmap;
      uVar5 = 0xffffffff;
      uVar9 = 0;
      uVar12 = 0xfffffff8;
      uVar6 = 0xffffffff;
      do {
        bVar1 = *puVar10;
        uVar2 = uVar5;
        if (bVar1 != 0) {
          if ((bVar1 & bVar1 - 1) == 0) {
            uVar14 = (ulong)(uVar12 + 8);
            if (bVar1 < 0x10) {
              if (bVar1 == 2) {
                uVar14 = (ulong)(uVar9 | 1);
              }
              else if (bVar1 == 4) {
                uVar14 = (ulong)(uVar9 | 2);
              }
              else if (bVar1 == 8) {
                uVar14 = (ulong)(uVar9 | 3);
              }
            }
            else if (bVar1 < 0x40) {
              if (bVar1 == 0x10) {
                uVar14 = (ulong)(uVar9 | 4);
              }
              else if (bVar1 == 0x20) {
                uVar14 = (ulong)(uVar9 | 5);
              }
            }
            else if (bVar1 == 0x40) {
              uVar14 = (ulong)(uVar9 | 6);
            }
            else if (bVar1 == 0x80) {
              uVar14 = (ulong)(uVar9 | 7);
            }
            uVar13 = (uint)uVar14;
            if (((uVar11 == 0) || (uVar13 < 0x80)) &&
               ((uVar2 = uVar13, (int)uVar5 < 0 ||
                (((int)uVar6 < 0 &&
                 (uVar2 = uVar5, uVar6 = uVar13, uVar5 == re->tables[uVar14 + 0x100]))))))
            goto LAB_0014b080;
          }
          uVar9 = re->flags;
          uVar12 = 0x40;
          goto LAB_0014b0c7;
        }
LAB_0014b080:
        uVar5 = uVar2;
        puVar10 = puVar10 + 1;
        uVar9 = uVar9 + 8;
        uVar12 = uVar12 + 8;
      } while (uVar12 < 0xf8);
      uVar9 = re->flags;
      uVar12 = 0x40;
      if ((-1 < (int)uVar5) &&
         ((-1 < (char)uVar9 ||
          ((re->last_codeunit != uVar5 && ((int)uVar6 < 0 || re->last_codeunit != uVar6)))))) {
        re->first_codeunit = uVar5;
        uVar12 = ~uVar6 >> 0x1a & 0xffffffe0 | 0x10;
      }
LAB_0014b0c7:
      uVar9 = uVar9 | uVar12;
      re->flags = uVar9;
    }
    else {
      if (iVar4 == 3) {
        return 1;
      }
      uVar9 = re->flags;
    }
  }
  iVar4 = 0;
  if (((uVar9 & 0x802000) == 0) && (iVar4 = 0, re->top_backref < 0x81)) {
    local_22c[1] = 0;
    iVar4 = 0;
    iVar3 = find_minlength(re,code,code,uVar11 >> 0x13,(recurse_check *)0x0,local_22c,local_22c + 1)
    ;
    if (iVar3 != -1) {
      if (iVar3 == -2) {
        iVar4 = 2;
      }
      else if (iVar3 == -3) {
        iVar4 = 3;
      }
      else {
        iVar7 = 0xffff;
        if (iVar3 < 0xffff) {
          iVar7 = iVar3;
        }
        re->minlength = (uint16_t)iVar7;
      }
    }
  }
  return iVar4;
}

Assistant:

int
PRIV(study)(pcre2_real_code *re)
{
int count = 0;
PCRE2_UCHAR *code;
BOOL utf = (re->overall_options & PCRE2_UTF) != 0;
BOOL ucp = (re->overall_options & PCRE2_UCP) != 0;

/* Find start of compiled code */

code = (PCRE2_UCHAR *)((uint8_t *)re + sizeof(pcre2_real_code)) +
  re->name_entry_size * re->name_count;

/* For a pattern that has a first code unit, or a multiline pattern that
matches only at "line start", there is no point in seeking a list of starting
code units. */

if ((re->flags & (PCRE2_FIRSTSET|PCRE2_STARTLINE)) == 0)
  {
  int depth = 0;
  int rc = set_start_bits(re, code, utf, ucp, &depth);
  if (rc == SSB_UNKNOWN) return 1;

  /* If a list of starting code units was set up, scan the list to see if only
  one or two were listed. Having only one listed is rare because usually a
  single starting code unit will have been recognized and PCRE2_FIRSTSET set.
  If two are listed, see if they are caseless versions of the same character;
  if so we can replace the list with a caseless first code unit. This gives
  better performance and is plausibly worth doing for patterns such as [Ww]ord
  or (word|WORD). */

  if (rc == SSB_DONE)
    {
    int i;
    int a = -1;
    int b = -1;
    uint8_t *p = re->start_bitmap;
    uint32_t flags = PCRE2_FIRSTMAPSET;

    for (i = 0; i < 256; p++, i += 8)
      {
      uint8_t x = *p;
      if (x != 0)
        {
        int c;
        uint8_t y = x & (~x + 1);   /* Least significant bit */
        if (y != x) goto DONE;      /* More than one bit set */

        /* In the 16-bit and 32-bit libraries, the bit for 0xff means "0xff and
        all wide characters", so we cannot use it here. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        if (i == 248 && x == 0x80) goto DONE;
#endif

        /* Compute the character value */

        c = i;
        switch (x)
          {
          case 1:   break;
          case 2:   c += 1; break;  case 4:  c += 2; break;
          case 8:   c += 3; break;  case 16: c += 4; break;
          case 32:  c += 5; break;  case 64: c += 6; break;
          case 128: c += 7; break;
          }

        /* c contains the code unit value, in the range 0-255. In 8-bit UTF
        mode, only values < 128 can be used. In all the other cases, c is a
        character value. */

#if PCRE2_CODE_UNIT_WIDTH == 8
        if (utf && c > 127) goto DONE;
#endif
        if (a < 0) a = c;   /* First one found, save in a */
        else if (b < 0)     /* Second one found */
          {
          int d = TABLE_GET((unsigned int)c, re->tables + fcc_offset, c);

#ifdef SUPPORT_UNICODE
          if (utf || ucp)
            {
            if (UCD_CASESET(c) != 0) goto DONE;     /* Multiple case set */
            if (c > 127) d = UCD_OTHERCASE(c);
            }
#endif  /* SUPPORT_UNICODE */

          if (d != a) goto DONE;   /* Not the other case of a */
          b = c;                   /* Save second in b */
          }
        else goto DONE;   /* More than two characters found */
        }
      }

    /* Replace the start code unit bits with a first code unit, but only if it
    is not the same as a required later code unit. This is because a search for
    a required code unit starts after an explicit first code unit, but at a
    code unit found from the bitmap. Patterns such as /a*a/ don't work
    if both the start unit and required unit are the same. */

    if (a >= 0 &&
        (
        (re->flags & PCRE2_LASTSET) == 0 ||
          (
          re->last_codeunit != (uint32_t)a &&
          (b < 0 || re->last_codeunit != (uint32_t)b)
          )
        ))
      {
      re->first_codeunit = a;
      flags = PCRE2_FIRSTSET;
      if (b >= 0) flags |= PCRE2_FIRSTCASELESS;
      }

    DONE:
    re->flags |= flags;
    }
  }

/* Find the minimum length of subject string. If the pattern can match an empty
string, the minimum length is already known. If the pattern contains (*ACCEPT)
all bets are off, and we don't even try to find a minimum length. If there are
more back references than the size of the vector we are going to cache them in,
do nothing. A pattern that complicated will probably take a long time to
analyze and may in any case turn out to be too complicated. Note that back
reference minima are held as 16-bit numbers. */

if ((re->flags & (PCRE2_MATCH_EMPTY|PCRE2_HASACCEPT)) == 0 &&
     re->top_backref <= MAX_CACHE_BACKREF)
  {
  int min;
  int backref_cache[MAX_CACHE_BACKREF+1];
  backref_cache[0] = 0;    /* Highest one that is set */
  min = find_minlength(re, code, code, utf, NULL, &count, backref_cache);
  switch(min)
    {
    case -1:  /* \C in UTF mode or over-complex regex */
    break;    /* Leave minlength unchanged (will be zero) */

    case -2:
    return 2; /* missing capturing bracket */

    case -3:
    return 3; /* unrecognized opcode */

    default:
    re->minlength = (min > UINT16_MAX)? UINT16_MAX : min;
    break;
    }
  }

return 0;
}